

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_inspect(REF_NODE ref_node)

{
  ulong uVar1;
  
  printf("ref_node = %p\n",ref_node);
  printf(" n = %d\n",(ulong)(uint)ref_node->n);
  printf(" max = %d\n",(ulong)(uint)ref_node->max);
  printf(" blank = %d\n",(ulong)(uint)ref_node->blank);
  if (0 < ref_node->max) {
    uVar1 = 0;
    do {
      if (-1 < ref_node->global[uVar1]) {
        printf(" global[%d] = %ld; part[%d] = %3d;\n",uVar1 & 0xffffffff,ref_node->global[uVar1],
               uVar1 & 0xffffffff,(ulong)(uint)ref_node->part[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)ref_node->max);
  }
  if (0 < ref_node->n) {
    uVar1 = 0;
    do {
      printf(" sorted_global[%d] = %ld sorted_local[%d] = %d\n",uVar1 & 0xffffffff,
             ref_node->sorted_global[uVar1],uVar1 & 0xffffffff,
             (ulong)(uint)ref_node->sorted_local[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((long)uVar1 < (long)ref_node->n);
  }
  printf(" old_n_global = %ld\n",ref_node->old_n_global);
  printf(" new_n_global = %ld\n",ref_node->new_n_global);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_inspect(REF_NODE ref_node) {
  REF_INT node;
  printf("ref_node = %p\n", (void *)ref_node);
  printf(" n = %d\n", ref_node_n(ref_node));
  printf(" max = %d\n", ref_node_max(ref_node));
  printf(" blank = %d\n", ref_node->blank);
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (0 <= ref_node->global[node])
      printf(" global[%d] = " REF_GLOB_FMT "; part[%d] = %3d;\n", node,
             ref_node->global[node], node, ref_node->part[node]);
  for (node = 0; node < ref_node_n(ref_node); node++)
    printf(" sorted_global[%d] = " REF_GLOB_FMT " sorted_local[%d] = %d\n",
           node, ref_node->sorted_global[node], node,
           ref_node->sorted_local[node]);
  printf(" old_n_global = " REF_GLOB_FMT "\n", ref_node->old_n_global);
  printf(" new_n_global = " REF_GLOB_FMT "\n", ref_node->new_n_global);
  return REF_SUCCESS;
}